

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialogPrivate::createWidgets(QFileDialogPrivate *this)

{
  QWidget *this_00;
  QFileDialogLineEdit *buddy;
  QFileDialogListView *pQVar1;
  QFileDialogTreeView *pQVar2;
  QSplitter *this_01;
  qsizetype qVar3;
  bool bVar4;
  WindowStates newstate;
  undefined4 uVar5;
  int iVar6;
  FileMode mode;
  AcceptMode mode_00;
  ViewMode mode_01;
  Options options;
  ulong uVar7;
  QFileSystemModel *pQVar8;
  QPlatformDialogHelper *pQVar9;
  Ui_QFileDialog *pUVar10;
  QFSCompleter *this_02;
  QShortcut *pQVar11;
  QWidget *pQVar12;
  QActionGroup *this_03;
  QAction *this_04;
  QItemSelectionModel *pQVar13;
  QItemSelectionModel *pQVar14;
  QUrl *url;
  char16_t **url_00;
  ConnectionType type;
  ConnectionType type_00;
  QItemSelectionModel *oldD;
  QAbstractProxyModel *pQVar15;
  int i;
  int iVar16;
  long lVar17;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QLatin1StringView latin1_02;
  QLatin1StringView latin1_03;
  QAnyStringView QVar18;
  QAnyStringView QVar19;
  QSize local_150;
  QUrl local_148;
  undefined1 *puStack_140;
  Object local_138 [8];
  Object local_130 [8];
  Object local_128 [8];
  undefined1 local_120 [16];
  Object local_110 [8];
  Object local_108 [8];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  undefined1 local_b0 [8];
  QArrayDataPointer<char16_t> local_a8;
  QFontMetrics fm;
  QArrayDataPointer<QUrl> local_88;
  Object local_70 [8];
  Object local_68 [8];
  Object local_60 [8];
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->qFileDialogUi).d != (Ui_QFileDialog *)0x0) goto LAB_00499d29;
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  bVar4 = QWidget::testAttribute_helper(this_00,WA_Resized);
  if (bVar4) {
    local_150 = QWidget::size(this_00);
    uVar7 = (ulong)local_150 >> 0x20;
  }
  else {
    uVar7 = 0xffffffffffffffff;
    local_150.wd.m_i = -1;
    local_150.ht.m_i = -1;
  }
  newstate = QWidget::windowState(this_00);
  pQVar8 = (QFileSystemModel *)operator_new(0x10);
  QFileSystemModel::QFileSystemModel(pQVar8,&this_00->super_QObject);
  this->model = pQVar8;
  QFileSystemModel::setIconProvider((QAbstractFileIconProvider *)pQVar8);
  pQVar8 = this->model;
  uVar5 = QFileDialogOptions::filter();
  QFileSystemModel::setFilter(pQVar8,uVar5);
  QVar18.m_size = (size_t)"qt_filesystem_model";
  QVar18.field_0 =
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)this->model;
  QObject::setObjectName(QVar18);
  pQVar9 = QDialogPrivate::platformHelper(&this->super_QDialogPrivate);
  pQVar8 = this->model;
  if (pQVar9 != (QPlatformDialogHelper *)0x0) {
    (**(code **)(*(long *)pQVar9 + 0x80))(pQVar9);
  }
  QFileSystemModel::setNameFilterDisables(SUB81(pQVar8,0));
  pQVar8 = this->model;
  *(undefined1 *)(*(long *)(pQVar8 + 8) + 0x1b4) = 1;
  local_58.d = (Data *)fileRenamed;
  local_58.ptr = (QString *)0x0;
  type = (ConnectionType)this;
  QObjectPrivate::
  connect<void(QFileSystemModel::*)(QString_const&,QString_const&,QString_const&),void(QFileDialogPrivate::*)(QString_const&,QString_const&,QString_const&)>
            (local_60,(offset_in_QFileSystemModel_to_subr)pQVar8,
             (Object *)QFileSystemModel::fileRenamed,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  local_58.d = (Data *)pathChanged;
  local_58.ptr = (QString *)0x0;
  QObjectPrivate::
  connect<void(QFileSystemModel::*)(QString_const&),void(QFileDialogPrivate::*)(QString_const&)>
            (local_68,(offset_in_QFileSystemModel_to_subr)this->model,
             (Object *)QFileSystemModel::rootPathChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  local_58.d = (Data *)rowsInserted;
  local_58.ptr = (QString *)0x0;
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QFileDialogPrivate::*)(QModelIndex_const&)>
            (local_70,(offset_in_QAbstractItemModel_to_subr)this->model,
             (Object *)QAbstractItemModel::rowsInserted,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_70);
  QFileSystemModel::setReadOnly(SUB81(this->model,0));
  pUVar10 = (Ui_QFileDialog *)operator_new(0xd0);
  memset(pUVar10,0,0xd0);
  QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::reset
            (&this->qFileDialogUi,pUVar10);
  Ui_QFileDialog::setupUi((this->qFileDialogUi).d,(QDialog *)this_00);
  local_88.d = (Data *)0x0;
  local_88.ptr = (QUrl *)0x0;
  local_88.size = 0;
  latin1.m_data = "file:";
  latin1.m_size = 5;
  QString::QString((QString *)&local_58,latin1);
  QUrl::QUrl(&local_148,(QString *)&local_58,TolerantMode);
  QList<QUrl>::emplaceBack<QUrl>((QList<QUrl> *)&local_88,&local_148);
  QDir::homePath();
  QUrl::fromLocalFile((QString *)&fm);
  QList<QUrl>::emplaceBack<QUrl>((QList<QUrl> *)&local_88,(QUrl *)&fm);
  QUrl::~QUrl((QUrl *)&fm);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  QUrl::~QUrl(&local_148);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  QSidebar::setModelAndUrls(((this->qFileDialogUi).d)->sidebar,this->model,(QList<QUrl> *)&local_88)
  ;
  local_58.d = (Data *)goToUrl;
  local_58.ptr = (QString *)0x0;
  QObjectPrivate::connect<void(QSidebar::*)(QUrl_const&),void(QFileDialogPrivate::*)(QUrl_const&)>
            ((Object *)local_b0,(offset_in_QSidebar_to_subr)((this->qFileDialogUi).d)->sidebar,
             (Object *)QSidebar::goToUrl,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_b0);
  local_58.d = (Data *)0x1b9;
  local_58.ptr = (QString *)0x0;
  type_00 = (ConnectionType)this_00;
  QObject::connect<void(QDialogButtonBox::*)(),void(QFileDialog::*)()>
            ((Object *)(local_c0 + 8),
             (offset_in_QDialogButtonBox_to_subr)((this->qFileDialogUi).d)->buttonBox,
             (ContextType *)QDialogButtonBox::accepted,(offset_in_QFileDialog_to_subr *)0x0,type_00)
  ;
  QMetaObject::Connection::~Connection((Connection *)(local_c0 + 8));
  local_58.d = (Data *)0x1c1;
  local_58.ptr = (QString *)0x0;
  QObject::connect<void(QDialogButtonBox::*)(),void(QDialog::*)()>
            ((Object *)local_c0,
             (offset_in_QDialogButtonBox_to_subr)((this->qFileDialogUi).d)->buttonBox,
             (ContextType *)QDialogButtonBox::rejected,(offset_in_QDialog_to_subr *)0x0,type_00);
  QMetaObject::Connection::~Connection((Connection *)local_c0);
  QFileDialogComboBox::setFileDialogPrivate(((this->qFileDialogUi).d)->lookInCombo,this);
  local_58.d = (Data *)goToDirectory;
  local_58.ptr = (QString *)0x0;
  QObjectPrivate::
  connect<void(QComboBox::*)(QString_const&),void(QFileDialogPrivate::*)(QString_const&)>
            ((Object *)(local_d0 + 8),
             (offset_in_QComboBox_to_subr)((this->qFileDialogUi).d)->lookInCombo,
             (Object *)QComboBox::textActivated,0,type);
  QMetaObject::Connection::~Connection((Connection *)(local_d0 + 8));
  QComboBox::setInsertPolicy(&((this->qFileDialogUi).d)->lookInCombo->super_QComboBox,NoInsert);
  QComboBox::setDuplicatesEnabled(&((this->qFileDialogUi).d)->lookInCombo->super_QComboBox,false);
  pUVar10 = (this->qFileDialogUi).d;
  buddy = pUVar10->fileNameEdit;
  buddy->d_ptr = this;
  QLabel::setBuddy(pUVar10->fileNameLabel,(QWidget *)buddy);
  this_02 = (QFSCompleter *)operator_new(0x20);
  QFSCompleter::QFSCompleter(this_02,this->model,&this_00->super_QObject);
  this->completer = this_02;
  QLineEdit::setCompleter
            (&((this->qFileDialogUi).d)->fileNameEdit->super_QLineEdit,(QCompleter *)this_02);
  QWidget::setInputMethodHints
            ((QWidget *)((this->qFileDialogUi).d)->fileNameEdit,(InputMethodHints)0x40);
  local_58.d = (Data *)autoCompleteFileName;
  local_58.ptr = (QString *)0x0;
  QObjectPrivate::
  connect<void(QLineEdit::*)(QString_const&),void(QFileDialogPrivate::*)(QString_const&)>
            ((Object *)local_d0,(offset_in_QLineEdit_to_subr)((this->qFileDialogUi).d)->fileNameEdit
             ,(Object *)QLineEdit::textChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_d0);
  local_58.d = (Data *)updateOkButton;
  local_58.ptr = (QString *)0x0;
  QObjectPrivate::connect<void(QLineEdit::*)(QString_const&),void(QFileDialogPrivate::*)()>
            ((Object *)(local_e0 + 8),
             (offset_in_QLineEdit_to_subr)((this->qFileDialogUi).d)->fileNameEdit,
             (Object *)QLineEdit::textChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)(local_e0 + 8));
  local_58.d = (Data *)0x1b9;
  local_58.ptr = (QString *)0x0;
  QObject::connect<void(QLineEdit::*)(),void(QFileDialog::*)()>
            ((Object *)local_e0,(offset_in_QLineEdit_to_subr)((this->qFileDialogUi).d)->fileNameEdit
             ,(ContextType *)QLineEdit::returnPressed,(offset_in_QFileDialog_to_subr *)0x0,type_00);
  QMetaObject::Connection::~Connection((Connection *)local_e0);
  QComboBox::setDuplicatesEnabled(((this->qFileDialogUi).d)->fileTypeCombo,false);
  iVar16 = 1;
  QComboBox::setSizeAdjustPolicy
            (((this->qFileDialogUi).d)->fileTypeCombo,AdjustToContentsOnFirstShow);
  QWidget::setSizePolicy
            (&((this->qFileDialogUi).d)->fileTypeCombo->super_QWidget,(QSizePolicy)0x70000);
  local_58.d = (Data *)useNameFilter;
  local_58.ptr = (QString *)0x0;
  QObjectPrivate::connect<void(QComboBox::*)(int),void(QFileDialogPrivate::*)(int)>
            ((Object *)(local_f0 + 8),
             (offset_in_QComboBox_to_subr)((this->qFileDialogUi).d)->fileTypeCombo,
             (Object *)QComboBox::activated,0,type);
  QMetaObject::Connection::~Connection((Connection *)(local_f0 + 8));
  local_58.d = (Data *)QFileDialog::filterSelected;
  local_58.ptr = (QString *)0x0;
  QObject::connect<void(QComboBox::*)(QString_const&),void(QFileDialog::*)(QString_const&)>
            ((Object *)local_f0,
             (offset_in_QComboBox_to_subr)((this->qFileDialogUi).d)->fileTypeCombo,
             (ContextType *)QComboBox::textActivated,(offset_in_QFileDialog_to_subr *)0x0,type_00);
  QMetaObject::Connection::~Connection((Connection *)local_f0);
  QFileDialogListView::setFileDialogPrivate(((this->qFileDialogUi).d)->listView,this);
  pQVar1 = ((this->qFileDialogUi).d)->listView;
  (**(code **)(*(long *)&(pQVar1->super_QListView).super_QAbstractItemView.super_QAbstractScrollArea
                         .super_QFrame.super_QWidget + 0x1c8))(pQVar1,this->model);
  local_58.d = (Data *)enterDirectory;
  local_58.ptr = (QString *)0x0;
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QFileDialogPrivate::*)(QModelIndex_const&)>
            ((Object *)(local_100 + 8),
             (offset_in_QAbstractItemView_to_subr)((this->qFileDialogUi).d)->listView,
             (Object *)QAbstractItemView::activated,0,type);
  QMetaObject::Connection::~Connection((Connection *)(local_100 + 8));
  local_58.d = (Data *)showContextMenu;
  local_58.ptr = (QString *)0x0;
  QObjectPrivate::
  connect<void(QWidget::*)(QPoint_const&),void(QFileDialogPrivate::*)(QPoint_const&)>
            ((Object *)local_100,(offset_in_QWidget_to_subr)((this->qFileDialogUi).d)->listView,
             (Object *)QWidget::customContextMenuRequested,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_100);
  pQVar11 = (QShortcut *)operator_new(0x10);
  QShortcut::QShortcut
            (pQVar11,Delete,(QObject *)((this->qFileDialogUi).d)->listView,(char *)0x0,(char *)0x0,
             WindowShortcut);
  local_58.d = (Data *)deleteCurrent;
  local_58.ptr = (QString *)0x0;
  QObjectPrivate::connect<void(QShortcut::*)(),void(QFileDialogPrivate::*)()>
            (local_108,(offset_in_QShortcut_to_subr)pQVar11,(Object *)QShortcut::activated,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_108);
  QFileDialogTreeView::setFileDialogPrivate(((this->qFileDialogUi).d)->treeView,this);
  pQVar2 = ((this->qFileDialogUi).d)->treeView;
  (**(code **)(*(long *)&(pQVar2->super_QTreeView).super_QAbstractItemView.super_QAbstractScrollArea
                         .super_QFrame.super_QWidget + 0x1c8))(pQVar2,this->model);
  pQVar12 = (QWidget *)QTreeView::header(&((this->qFileDialogUi).d)->treeView->super_QTreeView);
  _fm = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
  QFontMetrics::QFontMetrics(&fm,&this_00->data->fnt);
  latin1_00.m_data = "wwwwwwwwwwwwwwwwwwwwwwwwww";
  latin1_00.m_size = 0x1a;
  QString::QString((QString *)&local_58,latin1_00);
  iVar6 = QFontMetrics::horizontalAdvance((QString *)&fm,(int)&local_58);
  QHeaderView::resizeSection((QHeaderView *)pQVar12,0,iVar6);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  latin1_01.m_data = "128.88 GB";
  latin1_01.m_size = 9;
  QString::QString((QString *)&local_58,latin1_01);
  iVar6 = QFontMetrics::horizontalAdvance((QString *)&fm,(int)&local_58);
  QHeaderView::resizeSection((QHeaderView *)pQVar12,1,iVar6);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  latin1_02.m_data = "mp3Folder";
  latin1_02.m_size = 9;
  QString::QString((QString *)&local_58,latin1_02);
  iVar6 = QFontMetrics::horizontalAdvance((QString *)&fm,(int)&local_58);
  QHeaderView::resizeSection((QHeaderView *)pQVar12,2,iVar6);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  latin1_03.m_data = "10/29/81 02:02PM";
  latin1_03.m_size = 0x10;
  QString::QString((QString *)&local_58,latin1_03);
  iVar6 = QFontMetrics::horizontalAdvance((QString *)&fm,(int)&local_58);
  QHeaderView::resizeSection((QHeaderView *)pQVar12,3,iVar6);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  QWidget::setContextMenuPolicy(pQVar12,ActionsContextMenu);
  this_03 = (QActionGroup *)operator_new(0x10);
  QActionGroup::QActionGroup(this_03,&this_00->super_QObject);
  QActionGroup::setExclusive(SUB81(this_03,0));
  local_58.d = (Data *)showHeader;
  local_58.ptr = (QString *)0x0;
  QObjectPrivate::connect<void(QActionGroup::*)(QAction*),void(QFileDialogPrivate::*)(QAction*)>
            (local_110,(offset_in_QActionGroup_to_subr)this_03,(Object *)QActionGroup::triggered,0,
             type);
  QMetaObject::Connection::~Connection((Connection *)local_110);
  pQVar15 = this->proxyModel;
  if (pQVar15 == (QAbstractProxyModel *)0x0) {
    pQVar15 = (QAbstractProxyModel *)this->model;
  }
  while( true ) {
    local_58.d = (Data *)0xffffffffffffffff;
    local_58.ptr = (QString *)0x0;
    local_58.size = 0;
    iVar6 = (**(code **)(*(long *)pQVar15 + 0x80))(pQVar15,&local_58);
    if (iVar6 <= iVar16) break;
    this_04 = (QAction *)operator_new(0x10);
    QAction::QAction(this_04,(QObject *)this_03);
    QAction::setCheckable(SUB81(this_04,0));
    QAction::setChecked(SUB81(this_04,0));
    QWidget::addAction(pQVar12,this_04);
    iVar16 = iVar16 + 1;
  }
  pQVar13 = QAbstractItemView::selectionModel
                      ((QAbstractItemView *)((this->qFileDialogUi).d)->treeView);
  pUVar10 = (this->qFileDialogUi).d;
  pQVar2 = pUVar10->treeView;
  pQVar14 = QAbstractItemView::selectionModel((QAbstractItemView *)pUVar10->listView);
  (**(code **)(*(long *)&(pQVar2->super_QTreeView).super_QAbstractItemView.super_QAbstractScrollArea
                         .super_QFrame.super_QWidget + 0x1d0))(pQVar2,pQVar14);
  local_58.d = (Data *)enterDirectory;
  local_58.ptr = (QString *)0x0;
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QFileDialogPrivate::*)(QModelIndex_const&)>
            ((Object *)(local_120 + 8),
             (offset_in_QAbstractItemView_to_subr)((this->qFileDialogUi).d)->treeView,
             (Object *)QAbstractItemView::activated,0,type);
  QMetaObject::Connection::~Connection((Connection *)(local_120 + 8));
  local_58.d = (Data *)showContextMenu;
  local_58.ptr = (QString *)0x0;
  QObjectPrivate::
  connect<void(QWidget::*)(QPoint_const&),void(QFileDialogPrivate::*)(QPoint_const&)>
            ((Object *)local_120,(offset_in_QWidget_to_subr)((this->qFileDialogUi).d)->treeView,
             (Object *)QWidget::customContextMenuRequested,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_120);
  pQVar11 = (QShortcut *)operator_new(0x10);
  QShortcut::QShortcut
            (pQVar11,Delete,(QObject *)((this->qFileDialogUi).d)->treeView,(char *)0x0,(char *)0x0,
             WindowShortcut);
  local_58.d = (Data *)deleteCurrent;
  local_58.ptr = (QString *)0x0;
  QObjectPrivate::connect<void(QShortcut::*)(),void(QFileDialogPrivate::*)()>
            (local_128,(offset_in_QShortcut_to_subr)pQVar11,(Object *)QShortcut::activated,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_128);
  pQVar14 = QAbstractItemView::selectionModel
                      ((QAbstractItemView *)((this->qFileDialogUi).d)->listView);
  local_58.d = (Data *)selectionChanged;
  local_58.ptr = (QString *)0x0;
  QObjectPrivate::
  connect<void(QItemSelectionModel::*)(QItemSelection_const&,QItemSelection_const&),void(QFileDialogPrivate::*)()>
            (local_130,(offset_in_QItemSelectionModel_to_subr)pQVar14,
             (Object *)QItemSelectionModel::selectionChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_130);
  local_58.d = (Data *)currentChanged;
  local_58.ptr = (QString *)0x0;
  QObjectPrivate::
  connect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),void(QFileDialogPrivate::*)(QModelIndex_const&)>
            (local_138,(offset_in_QItemSelectionModel_to_subr)pQVar14,
             (Object *)QItemSelectionModel::currentChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_138);
  this_01 = ((this->qFileDialogUi).d)->splitter;
  pQVar12 = QSplitter::widget(this_01,1);
  iVar16 = QSplitter::indexOf(this_01,pQVar12);
  QSplitter::setStretchFactor(this_01,iVar16,7);
  createToolButtons(this);
  createMenuActions(this);
  bVar4 = restoreFromSettings(this);
  if (!bVar4) {
    local_148.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_140 = &DAT_aaaaaaaaaaaaaaaa;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_58,L"QtProject",9);
    local_a8.d = (Data *)0x0;
    local_a8.ptr = (char16_t *)0x0;
    local_a8.size = 0;
    QSettings::QSettings
              ((QSettings *)&local_148,UserScope,(QString *)&local_58,(QString *)&local_a8,
               (QObject *)0x0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    QtPrivate::lengthHelperContainer<char,14ul>((char (*) [14])"Qt/filedialog");
    QVar19.m_size = (size_t)&local_148;
    QVar19.field_0.m_data = &local_58;
    QSettings::value(QVar19);
    ::QVariant::toByteArray();
    QFileDialog::restoreState((QFileDialog *)this_00,(QByteArray *)&local_a8);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_a8);
    ::QVariant::~QVariant((QVariant *)&local_58);
    QSettings::~QSettings((QSettings *)&local_148);
  }
  mode = QFileDialogOptions::fileMode();
  QFileDialog::setFileMode((QFileDialog *)this_00,mode);
  mode_00 = QFileDialogOptions::acceptMode();
  QFileDialog::setAcceptMode((QFileDialog *)this_00,mode_00);
  mode_01 = QFileDialogOptions::viewMode();
  QFileDialog::setViewMode((QFileDialog *)this_00,mode_01);
  options.super_QFlagsStorageHelper<QFileDialog::Option,_4>.super_QFlagsStorage<QFileDialog::Option>
  .i = (QFlagsStorageHelper<QFileDialog::Option,_4>)QFileDialogOptions::options();
  QFileDialog::setOptions((QFileDialog *)this_00,options);
  QFileDialogOptions::sidebarUrls();
  qVar3 = local_58.size;
  QArrayDataPointer<QUrl>::~QArrayDataPointer((QArrayDataPointer<QUrl> *)&local_58);
  if (qVar3 != 0) {
    QFileDialogOptions::sidebarUrls();
    QFileDialog::setSidebarUrls((QFileDialog *)this_00,(QList<QUrl> *)&local_58);
    QArrayDataPointer<QUrl>::~QArrayDataPointer((QArrayDataPointer<QUrl> *)&local_58);
  }
  QFileDialogOptions::initialDirectory();
  QFileDialog::setDirectoryUrl((QFileDialog *)this_00,(QUrl *)&local_58);
  QUrl::~QUrl((QUrl *)&local_58);
  QFileDialogOptions::mimeTypeFilters();
  qVar3 = local_58.size;
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (qVar3 == 0) {
    QFileDialogOptions::nameFilters();
    qVar3 = local_58.size;
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
    if (qVar3 != 0) {
      QFileDialogOptions::nameFilters();
      QFileDialog::setNameFilters((QFileDialog *)this_00,(QStringList *)&local_58);
      goto LAB_00499b6f;
    }
  }
  else {
    QFileDialogOptions::mimeTypeFilters();
    QFileDialog::setMimeTypeFilters((QFileDialog *)this_00,(QStringList *)&local_58);
LAB_00499b6f:
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  }
  QFileDialogOptions::initiallySelectedNameFilter();
  QFileDialog::selectNameFilter((QFileDialog *)this_00,(QString *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  QFileDialogOptions::defaultSuffix();
  QFileDialog::setDefaultSuffix((QFileDialog *)this_00,(QString *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  QFileDialogOptions::history();
  QFileDialog::setHistory((QFileDialog *)this_00,(QStringList *)&local_58);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QFileDialogOptions::initiallySelectedFiles();
  if ((undefined1 *)local_58.size == (undefined1 *)0x1) {
    QUrl::fileName(&local_a8,local_58.ptr,0x7f00000);
    QFileDialog::selectFile((QFileDialog *)this_00,(QString *)&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  }
  url_00 = (char16_t **)local_58.ptr;
  for (lVar17 = local_58.size << 3; lVar17 != 0; lVar17 = lVar17 + -8) {
    QFileDialog::selectUrl((QFileDialog *)this_00,(QUrl *)url_00);
    url_00 = url_00 + 1;
  }
  QLineEdit::selectAll(&((this->qFileDialogUi).d)->fileNameEdit->super_QLineEdit);
  updateOkButton(this);
  retranslateStrings(this);
  if ((int)(local_150.wd.m_i.m_i | (uint)uVar7) < 0) {
    local_a8.d = (Data *)(**(code **)(*(long *)this_00 + 0x70))(this_00);
  }
  else {
    local_a8.d = (Data *)((ulong)local_150 & 0xffffffff | uVar7 << 0x20);
  }
  QWidget::resize(this_00,(QSize *)&local_a8);
  QWidget::setWindowState(this_00,newstate);
  QArrayDataPointer<QUrl>::~QArrayDataPointer((QArrayDataPointer<QUrl> *)&local_58);
  if (pQVar13 != (QItemSelectionModel *)0x0) {
    (**(code **)(*(long *)pQVar13 + 0x20))(pQVar13);
  }
  QFontMetrics::~QFontMetrics(&fm);
  QArrayDataPointer<QUrl>::~QArrayDataPointer(&local_88);
LAB_00499d29:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialogPrivate::createWidgets()
{
    if (qFileDialogUi)
        return;
    Q_Q(QFileDialog);

    // This function is sometimes called late (e.g as a fallback from setVisible). In that case we
    // need to ensure that the following UI code (setupUI in particular) doesn't reset any explicitly
    // set window state or geometry.
    QSize preSize = q->testAttribute(Qt::WA_Resized) ? q->size() : QSize();
    Qt::WindowStates preState = q->windowState();

    model = new QFileSystemModel(q);
    model->setIconProvider(&defaultIconProvider);
    model->setFilter(options->filter());
    model->setObjectName("qt_filesystem_model"_L1);
    if (QPlatformFileDialogHelper *helper = platformFileDialogHelper())
        model->setNameFilterDisables(helper->defaultNameFilterDisables());
    else
        model->setNameFilterDisables(false);
    model->d_func()->disableRecursiveSort = true;
    QObjectPrivate::connect(model, &QFileSystemModel::fileRenamed,
                            this, &QFileDialogPrivate::fileRenamed);
    QObjectPrivate::connect(model, &QFileSystemModel::rootPathChanged,
                            this, &QFileDialogPrivate::pathChanged);
    QObjectPrivate::connect(model, &QFileSystemModel::rowsInserted,
                            this, &QFileDialogPrivate::rowsInserted);
    model->setReadOnly(false);

    qFileDialogUi.reset(new Ui_QFileDialog());
    qFileDialogUi->setupUi(q);

    QList<QUrl> initialBookmarks;
    initialBookmarks << QUrl("file:"_L1)
                     << QUrl::fromLocalFile(QDir::homePath());
    qFileDialogUi->sidebar->setModelAndUrls(model, initialBookmarks);
    QObjectPrivate::connect(qFileDialogUi->sidebar, &QSidebar::goToUrl,
                            this, &QFileDialogPrivate::goToUrl);

    QObject::connect(qFileDialogUi->buttonBox, &QDialogButtonBox::accepted,
                     q, &QFileDialog::accept);
    QObject::connect(qFileDialogUi->buttonBox, &QDialogButtonBox::rejected,
                     q, &QFileDialog::reject);

    qFileDialogUi->lookInCombo->setFileDialogPrivate(this);
    QObjectPrivate::connect(qFileDialogUi->lookInCombo, &QComboBox::textActivated,
                            this, &QFileDialogPrivate::goToDirectory);

    qFileDialogUi->lookInCombo->setInsertPolicy(QComboBox::NoInsert);
    qFileDialogUi->lookInCombo->setDuplicatesEnabled(false);

    // filename
    qFileDialogUi->fileNameEdit->setFileDialogPrivate(this);
#ifndef QT_NO_SHORTCUT
    qFileDialogUi->fileNameLabel->setBuddy(qFileDialogUi->fileNameEdit);
#endif
#if QT_CONFIG(fscompleter)
    completer = new QFSCompleter(model, q);
    qFileDialogUi->fileNameEdit->setCompleter(completer);
#endif // QT_CONFIG(fscompleter)

    qFileDialogUi->fileNameEdit->setInputMethodHints(Qt::ImhNoPredictiveText);

    QObjectPrivate::connect(qFileDialogUi->fileNameEdit, &QLineEdit::textChanged,
                            this, &QFileDialogPrivate::autoCompleteFileName);
    QObjectPrivate::connect(qFileDialogUi->fileNameEdit, &QLineEdit::textChanged,
                            this, &QFileDialogPrivate::updateOkButton);
    QObject::connect(qFileDialogUi->fileNameEdit, &QLineEdit::returnPressed,
                     q, &QFileDialog::accept);

    // filetype
    qFileDialogUi->fileTypeCombo->setDuplicatesEnabled(false);
    qFileDialogUi->fileTypeCombo->setSizeAdjustPolicy(QComboBox::AdjustToContentsOnFirstShow);
    qFileDialogUi->fileTypeCombo->setSizePolicy(QSizePolicy::Expanding, QSizePolicy::Fixed);
    QObjectPrivate::connect(qFileDialogUi->fileTypeCombo, &QComboBox::activated,
                            this, &QFileDialogPrivate::useNameFilter);
    QObject::connect(qFileDialogUi->fileTypeCombo, &QComboBox::textActivated,
                     q, &QFileDialog::filterSelected);

    qFileDialogUi->listView->setFileDialogPrivate(this);
    qFileDialogUi->listView->setModel(model);
    QObjectPrivate::connect(qFileDialogUi->listView, &QAbstractItemView::activated,
                            this, &QFileDialogPrivate::enterDirectory);
    QObjectPrivate::connect(qFileDialogUi->listView, &QAbstractItemView::customContextMenuRequested,
                            this, &QFileDialogPrivate::showContextMenu);
#ifndef QT_NO_SHORTCUT
    QShortcut *shortcut = new QShortcut(QKeySequence::Delete, qFileDialogUi->listView);
    QObjectPrivate::connect(shortcut, &QShortcut::activated,
                            this, &QFileDialogPrivate::deleteCurrent);
#endif

    qFileDialogUi->treeView->setFileDialogPrivate(this);
    qFileDialogUi->treeView->setModel(model);
    QHeaderView *treeHeader = qFileDialogUi->treeView->header();
    QFontMetrics fm(q->font());
    treeHeader->resizeSection(0, fm.horizontalAdvance("wwwwwwwwwwwwwwwwwwwwwwwwww"_L1));
    treeHeader->resizeSection(1, fm.horizontalAdvance("128.88 GB"_L1));
    treeHeader->resizeSection(2, fm.horizontalAdvance("mp3Folder"_L1));
    treeHeader->resizeSection(3, fm.horizontalAdvance("10/29/81 02:02PM"_L1));
    treeHeader->setContextMenuPolicy(Qt::ActionsContextMenu);

    QActionGroup *showActionGroup = new QActionGroup(q);
    showActionGroup->setExclusive(false);
    QObjectPrivate::connect(showActionGroup, &QActionGroup::triggered,
                            this, &QFileDialogPrivate::showHeader);

    QAbstractItemModel *abstractModel = model;
#if QT_CONFIG(proxymodel)
    if (proxyModel)
        abstractModel = proxyModel;
#endif
    for (int i = 1; i < abstractModel->columnCount(QModelIndex()); ++i) {
        QAction *showHeader = new QAction(showActionGroup);
        showHeader->setCheckable(true);
        showHeader->setChecked(true);
        treeHeader->addAction(showHeader);
    }

    QScopedPointer<QItemSelectionModel> selModel(qFileDialogUi->treeView->selectionModel());
    qFileDialogUi->treeView->setSelectionModel(qFileDialogUi->listView->selectionModel());

    QObjectPrivate::connect(qFileDialogUi->treeView, &QAbstractItemView::activated,
                            this, &QFileDialogPrivate::enterDirectory);
    QObjectPrivate::connect(qFileDialogUi->treeView, &QAbstractItemView::customContextMenuRequested,
                            this, &QFileDialogPrivate::showContextMenu);
#ifndef QT_NO_SHORTCUT
    shortcut = new QShortcut(QKeySequence::Delete, qFileDialogUi->treeView);
    QObjectPrivate::connect(shortcut, &QShortcut::activated,
                            this, &QFileDialogPrivate::deleteCurrent);
#endif

    // Selections
    QItemSelectionModel *selections = qFileDialogUi->listView->selectionModel();
    QObjectPrivate::connect(selections, &QItemSelectionModel::selectionChanged,
                            this, &QFileDialogPrivate::selectionChanged);
    QObjectPrivate::connect(selections, &QItemSelectionModel::currentChanged,
                            this, &QFileDialogPrivate::currentChanged);
    qFileDialogUi->splitter->setStretchFactor(qFileDialogUi->splitter->indexOf(qFileDialogUi->splitter->widget(1)), QSizePolicy::Expanding);

    createToolButtons();
    createMenuActions();

#if QT_CONFIG(settings)
    // Try to restore from the FileDialog settings group; if it fails, fall back
    // to the pre-5.5 QByteArray serialized settings.
    if (!restoreFromSettings()) {
        const QSettings settings(QSettings::UserScope, u"QtProject"_s);
        q->restoreState(settings.value("Qt/filedialog").toByteArray());
    }
#endif

    // Initial widget states from options
    q->setFileMode(static_cast<QFileDialog::FileMode>(options->fileMode()));
    q->setAcceptMode(static_cast<QFileDialog::AcceptMode>(options->acceptMode()));
    q->setViewMode(static_cast<QFileDialog::ViewMode>(options->viewMode()));
    q->setOptions(static_cast<QFileDialog::Options>(static_cast<int>(options->options())));
    if (!options->sidebarUrls().isEmpty())
        q->setSidebarUrls(options->sidebarUrls());
    q->setDirectoryUrl(options->initialDirectory());
#if QT_CONFIG(mimetype)
    if (!options->mimeTypeFilters().isEmpty())
        q->setMimeTypeFilters(options->mimeTypeFilters());
    else
#endif
    if (!options->nameFilters().isEmpty())
        q->setNameFilters(options->nameFilters());
    q->selectNameFilter(options->initiallySelectedNameFilter());
    q->setDefaultSuffix(options->defaultSuffix());
    q->setHistory(options->history());
    const auto initiallySelectedFiles = options->initiallySelectedFiles();
    if (initiallySelectedFiles.size() == 1)
        q->selectFile(initiallySelectedFiles.first().fileName());
    for (const QUrl &url : initiallySelectedFiles)
        q->selectUrl(url);
    lineEdit()->selectAll();
    updateOkButton();
    retranslateStrings();
    q->resize(preSize.isValid() ? preSize : q->sizeHint());
    q->setWindowState(preState);
}